

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoTuplesContactN.h
# Opt level: O2

void __thiscall
chrono::
ChConstraintTwoTuplesContactN<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
::Project(ChConstraintTwoTuplesContactN<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
          *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ChConstraintTwoTuplesFrictionT<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  *pCVar4;
  ChConstraintTwoTuplesFrictionT<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  *pCVar5;
  double dVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  pCVar4 = this->constraint_U;
  if ((pCVar4 != (ChConstraintTwoTuplesFrictionT<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
                  *)0x0) &&
     (pCVar5 = this->constraint_V,
     pCVar5 != (ChConstraintTwoTuplesFrictionT<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
                *)0x0)) {
    dVar12 = (this->super_ChConstraintTwoTuplesContactNall).friction;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar12;
    dVar1 = (this->super_ChConstraintTwoTuplesContactNall).cohesion;
    dVar10 = dVar1 + (this->
                     super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
                     ).super_ChConstraint.l_i;
    if ((dVar12 != 0.0) || (NAN(dVar12))) {
      auVar9._8_8_ = 0x7fffffffffffffff;
      auVar9._0_8_ = 0x7fffffffffffffff;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = dVar10;
      auVar9 = vandpd_avx512vl(auVar11,auVar9);
      if (1e-14 <= auVar9._0_8_) {
        dVar6 = dVar12 * dVar12;
        dVar2 = (pCVar4->
                super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
                ).super_ChConstraint.l_i;
        dVar3 = (pCVar5->
                super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
                ).super_ChConstraint.l_i;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = dVar3;
        uVar7 = vcmppd_avx512vl(auVar11,ZEXT816(0) << 0x40,2);
        auVar16._0_8_ = (dVar10 * dVar10) / dVar6;
        auVar16._8_8_ = 0;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = dVar2 * dVar2;
        auVar9 = vfmadd231sd_fma(auVar15,auVar14,auVar14);
        uVar8 = vcmppd_avx512vl(auVar9,auVar16,1);
        if (((uint)((byte)uVar7 & 3) & (uint)uVar8 & 1) == 0) {
          if (auVar9._0_8_ < dVar10 * dVar10 * dVar6) {
            return;
          }
          auVar9 = vsqrtsd_avx(auVar9,auVar9);
          auVar13 = vfmadd231sd_fma(auVar11,auVar9,auVar13);
          dVar10 = auVar13._0_8_ / (dVar6 + 1.0);
          dVar12 = (dVar12 * dVar10) / auVar9._0_8_;
          (this->
          super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
          ).super_ChConstraint.l_i = dVar10 - dVar1;
          (pCVar4->
          super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
          ).super_ChConstraint.l_i = dVar2 * dVar12;
          (pCVar5->
          super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
          ).super_ChConstraint.l_i = dVar3 * dVar12;
          return;
        }
      }
      (this->
      super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
      ).super_ChConstraint.l_i = 0.0;
      (pCVar4->
      super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
      ).super_ChConstraint.l_i = 0.0;
      (pCVar5->
      super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
      ).super_ChConstraint.l_i = 0.0;
      return;
    }
    (pCVar4->
    super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
    ).super_ChConstraint.l_i = 0.0;
    (pCVar5->
    super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
    ).super_ChConstraint.l_i = 0.0;
    if (dVar10 < 0.0) {
      (this->
      super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
      ).super_ChConstraint.l_i = 0.0;
      return;
    }
  }
  return;
}

Assistant:

virtual void Project() override {
        if (!constraint_U || !constraint_V)
            return;

        // Anitescu-Tasora projection on cone generator and polar cone
        // (contractive, but performs correction on three components: normal,u,v)

        double f_n = this->l_i + this->cohesion;

		// no friction? project to axis of upper cone
        if (friction == 0) {
            constraint_U->Set_l_i(0);
            constraint_V->Set_l_i(0);
            if (f_n < 0)
                this->Set_l_i(0);
            return;
        }

        double f_u = constraint_U->Get_l_i();
        double f_v = constraint_V->Get_l_i();

        double mu2 = friction * friction;
        double f_n2 = f_n * f_n;
        double f_t2 = (f_v * f_v + f_u * f_u);

        // inside lower cone or close to origin? reset normal, u, v to zero!
        if ((f_n <= 0 && f_t2 < f_n2 / mu2) || (f_n < 1e-14 && f_n > -1e-14)) {
            this->Set_l_i(0);
            constraint_U->Set_l_i(0);
            constraint_V->Set_l_i(0);
            return;
        }

        // inside upper cone? keep untouched!
        if (f_t2 < f_n2 * mu2)
            return;

        // project orthogonally to generator segment of upper cone
        double f_t = sqrt(f_t2);
		double f_n_proj = (f_t * friction + f_n) / (mu2 + 1);
        double f_t_proj = f_n_proj * friction;
        double tproj_div_t = f_t_proj / f_t;
        double f_u_proj = tproj_div_t * f_u;
        double f_v_proj = tproj_div_t * f_v;

        this->Set_l_i(f_n_proj - this->cohesion);
        constraint_U->Set_l_i(f_u_proj);
        constraint_V->Set_l_i(f_v_proj);
    }